

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O2

int __thiscall hierarchy_info::init(hierarchy_info *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  char cVar2;
  undefined8 in_RAX;
  kmp_uint32 *pkVar3;
  kmp_uint32 *pkVar4;
  kmp_uint32 i_1;
  uint uVar6;
  kmp_uint32 kVar7;
  uint uVar8;
  ulong uVar9;
  uint in_EDX;
  ulong uVar10;
  undefined7 uVar5;
  
  uVar5 = (undefined7)((ulong)in_RAX >> 8);
  pkVar3 = (kmp_uint32 *)CONCAT71(uVar5,1);
  LOCK();
  cVar2 = this->uninitialized;
  if (cVar2 == '\x01') {
    this->uninitialized = '\x02';
  }
  else {
    pkVar3 = (kmp_uint32 *)CONCAT71(uVar5,cVar2);
  }
  UNLOCK();
  if (cVar2 == '\x01') {
    this->resizing = '\0';
    this->maxLevels = 7;
    this->depth = 1;
    pkVar4 = (kmp_uint32 *)___kmp_allocate(0x38);
    this->numPerLevel = pkVar4;
    uVar9 = (ulong)this->maxLevels;
    pkVar3 = pkVar4 + uVar9;
    this->skipPerLevel = pkVar3;
    for (uVar10 = 0; uVar10 < uVar9; uVar10 = uVar10 + 1) {
      pkVar4[uVar10] = 1;
      pkVar3[uVar10] = 1;
      uVar9 = (ulong)this->maxLevels;
    }
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      *pkVar4 = 4;
      pkVar4[1] = in_EDX >> 2;
      if ((in_EDX & 3) != 0) {
        pkVar4[1] = (in_EDX >> 2) + 1;
      }
    }
    else {
      qsort(ctx,(long)(int)in_EDX,0x10c,__kmp_affinity_cmp_Address_labels);
      deriveLevels(this,(AddrUnsPair *)ctx,in_EDX);
    }
    this->base_num_threads = in_EDX;
    uVar8 = this->maxLevels;
    uVar6 = this->depth;
    pkVar3 = this->numPerLevel;
    while (uVar8 = uVar8 - 1, -1 < (int)uVar8) {
      if ((pkVar3[uVar8 & 0x7fffffff] != 1) || (1 < uVar6)) {
        uVar6 = uVar6 + 1;
        this->depth = uVar6;
      }
    }
    uVar10 = (ulong)(in_EDX >> 2);
    if (in_EDX >> 2 < 5) {
      uVar10 = 4;
    }
    if (*pkVar3 != 1) {
      uVar10 = 4;
    }
    uVar9 = 0;
    while (uVar9 < uVar6 - 1) {
      uVar1 = uVar9 + 1;
      while( true ) {
        uVar8 = pkVar3[uVar9];
        if ((uVar8 <= (uint)uVar10) && (uVar9 != 0 || uVar8 < 5)) break;
        pkVar3[uVar9] = (uVar8 & 1) + uVar8 >> 1;
        kVar7 = pkVar3[uVar1];
        if (kVar7 == 1) {
          this->depth = this->depth + 1;
          kVar7 = pkVar3[uVar1];
        }
        pkVar3[uVar1] = kVar7 * 2;
      }
      uVar8 = (uint)(uVar10 >> 1);
      if (uVar8 < 5) {
        uVar8 = 4;
      }
      if (*pkVar3 == 1) {
        uVar10 = (ulong)uVar8;
      }
      uVar9 = uVar1;
      uVar6 = this->depth;
    }
    pkVar4 = this->skipPerLevel;
    for (uVar10 = 1; uVar9 = (ulong)uVar6, uVar10 < uVar9; uVar10 = uVar10 + 1) {
      pkVar4[uVar10] = pkVar4[uVar10 - 1] * pkVar3[uVar10 - 1];
      uVar6 = this->depth;
    }
    pkVar3 = this->skipPerLevel;
    for (; uVar9 < this->maxLevels; uVar9 = uVar9 + 1) {
      pkVar3[uVar9] = pkVar3[(int)uVar9 - 1] * 2;
    }
    this->uninitialized = '\0';
  }
  else {
    do {
    } while (this->uninitialized != '\0');
  }
  return (int)pkVar3;
}

Assistant:

void init(AddrUnsPair *adr2os, int num_addrs) {
    kmp_int8 bool_result = KMP_COMPARE_AND_STORE_ACQ8(
        &uninitialized, not_initialized, initializing);
    if (bool_result == 0) { // Wait for initialization
      while (TCR_1(uninitialized) != initialized)
        KMP_CPU_PAUSE();
      return;
    }
    KMP_DEBUG_ASSERT(bool_result == 1);

    /* Added explicit initialization of the data fields here to prevent usage of
       dirty value observed when static library is re-initialized multiple times
       (e.g. when non-OpenMP thread repeatedly launches/joins thread that uses
       OpenMP). */
    depth = 1;
    resizing = 0;
    maxLevels = 7;
    numPerLevel =
        (kmp_uint32 *)__kmp_allocate(maxLevels * 2 * sizeof(kmp_uint32));
    skipPerLevel = &(numPerLevel[maxLevels]);
    for (kmp_uint32 i = 0; i < maxLevels;
         ++i) { // init numPerLevel[*] to 1 item per level
      numPerLevel[i] = 1;
      skipPerLevel[i] = 1;
    }

    // Sort table by physical ID
    if (adr2os) {
      qsort(adr2os, num_addrs, sizeof(*adr2os),
            __kmp_affinity_cmp_Address_labels);
      deriveLevels(adr2os, num_addrs);
    } else {
      numPerLevel[0] = maxLeaves;
      numPerLevel[1] = num_addrs / maxLeaves;
      if (num_addrs % maxLeaves)
        numPerLevel[1]++;
    }

    base_num_threads = num_addrs;
    for (int i = maxLevels - 1; i >= 0;
         --i) // count non-empty levels to get depth
      if (numPerLevel[i] != 1 || depth > 1) // only count one top-level '1'
        depth++;

    kmp_uint32 branch = minBranch;
    if (numPerLevel[0] == 1)
      branch = num_addrs / maxLeaves;
    if (branch < minBranch)
      branch = minBranch;
    for (kmp_uint32 d = 0; d < depth - 1; ++d) { // optimize hierarchy width
      while (numPerLevel[d] > branch ||
             (d == 0 && numPerLevel[d] > maxLeaves)) { // max 4 on level 0!
        if (numPerLevel[d] & 1)
          numPerLevel[d]++;
        numPerLevel[d] = numPerLevel[d] >> 1;
        if (numPerLevel[d + 1] == 1)
          depth++;
        numPerLevel[d + 1] = numPerLevel[d + 1] << 1;
      }
      if (numPerLevel[0] == 1) {
        branch = branch >> 1;
        if (branch < 4)
          branch = minBranch;
      }
    }

    for (kmp_uint32 i = 1; i < depth; ++i)
      skipPerLevel[i] = numPerLevel[i - 1] * skipPerLevel[i - 1];
    // Fill in hierarchy in the case of oversubscription
    for (kmp_uint32 i = depth; i < maxLevels; ++i)
      skipPerLevel[i] = 2 * skipPerLevel[i - 1];

    uninitialized = initialized; // One writer
  }